

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

void prvTidyPushInline(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  uint uVar2;
  Lexer *pLVar3;
  IStack *pIVar4;
  Dict *pDVar5;
  tmbstr ptVar6;
  AttVal *pAVar7;
  ulong uVar8;
  ulong uVar9;
  Lexer *lexer;
  
  if (node->implicit != no) {
    return;
  }
  pDVar5 = node->tag;
  if ((((pDVar5 != (Dict *)0x0) && ((pDVar5->model & 0x810) == 0x10)) &&
      (TVar1 = pDVar5->id, TVar1 != TidyTag_DEL)) && (TVar1 != TidyTag_INS)) {
    pLVar3 = doc->lexer;
    if (TVar1 == TidyTag_FONT) {
      uVar8 = (ulong)pLVar3->istacksize;
LAB_0013eada:
      uVar2 = pLVar3->istacklength;
      if (uVar2 < (int)uVar8 + 1U) {
        uVar9 = 0xc;
        if (uVar2 != 0) {
          uVar9 = (ulong)(uVar2 * 2);
        }
        pLVar3->istacklength = (uint)uVar9;
        pIVar4 = (IStack *)
                 (*doc->allocator->vtbl->realloc)(doc->allocator,pLVar3->istack,uVar9 << 5);
        pLVar3->istack = pIVar4;
        uVar8 = (ulong)pLVar3->istacksize;
        pDVar5 = node->tag;
      }
      else {
        pIVar4 = pLVar3->istack;
      }
      pIVar4[uVar8].tag = pDVar5;
      ptVar6 = prvTidytmbstrdup(doc->allocator,node->element);
      pIVar4[uVar8].element = ptVar6;
      pAVar7 = prvTidyDupAttrs(doc,node->attributes);
      pIVar4[uVar8].attributes = pAVar7;
      pLVar3->istacksize = pLVar3->istacksize + 1;
    }
    else {
      uVar8 = (ulong)pLVar3->istacksize;
      uVar9 = uVar8;
      do {
        uVar9 = uVar9 - 1;
        if ((int)(uint)uVar9 < 0) goto LAB_0013eada;
      } while (pLVar3->istack[(uint)uVar9 & 0x7fffffff].tag != pDVar5);
    }
  }
  return;
}

Assistant:

void TY_(PushInline)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;
    IStack *istack;

    if (node->implicit)
        return;

    if ( !IsNodePushable(node) )
        return;

    if ( !nodeIsFONT(node) && TY_(IsPushed)(doc, node) )
        return;

    /* make sure there is enough space for the stack */
    if (lexer->istacksize + 1 > lexer->istacklength)
    {
        if (lexer->istacklength == 0)
            lexer->istacklength = 6;   /* this is perhaps excessive */

        lexer->istacklength = lexer->istacklength * 2;
        lexer->istack = (IStack *)TidyDocRealloc(doc, lexer->istack,
                            sizeof(IStack)*(lexer->istacklength));
    }

    istack = &(lexer->istack[lexer->istacksize]);
    istack->tag = node->tag;

    istack->element = TY_(tmbstrdup)(doc->allocator, node->element);
    istack->attributes = TY_(DupAttrs)( doc, node->attributes );
    ++(lexer->istacksize);
}